

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void to_top_or_bottom_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,bool to_top,
               Am_Value *new_sel)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *in_value;
  Am_Value local_d0;
  Am_Object local_c0;
  Am_Value_List local_b8;
  Am_Value_List local_a8;
  Am_Object local_98;
  undefined1 local_90 [8];
  Am_Value_List places;
  Am_Object group;
  Am_Object local_70;
  byte local_61;
  bool currently_undone;
  Am_Object local_58;
  undefined1 local_50 [8];
  Am_Value_List objs;
  Am_Object local_30;
  Am_Object obj;
  Am_Object selection_widget;
  Am_Value *new_sel_local;
  bool to_top_local;
  bool reload_data_local;
  bool selective_local;
  bool undo_local;
  Am_Object *command_obj_local;
  
  Am_Object::Am_Object(&obj);
  Am_Object::Am_Object(&local_30);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_50);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffa0,command_obj);
  Am_Get_Selection_Widget_For_Command(&local_58);
  Am_Object::operator=(&obj,&local_58);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffa0);
  pAVar2 = Am_Object::Get(command_obj,0x16d,0);
  Am_Value_List::operator=((Am_Value_List *)local_50,pAVar2);
  if (undo) {
    if (selective) {
      Am_Error("Selective Undo of to top not allowed");
    }
    pAVar2 = Am_Object::Get(command_obj,0x16f,0);
    local_61 = Am_Value::operator_cast_to_bool(pAVar2);
    if ((bool)local_61) {
      if (to_top) {
        Am_Value_List::Start((Am_Value_List *)local_50);
        while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_50), ((bVar1 ^ 0xffU) & 1) != 0) {
          pAVar2 = Am_Value_List::Get((Am_Value_List *)local_50);
          Am_Object::operator=(&local_30,pAVar2);
          Am_Object::Am_Object(&local_70,&local_30);
          Am_To_Top(&local_70);
          Am_Object::~Am_Object(&local_70);
          Am_Value_List::Next((Am_Value_List *)local_50);
        }
      }
      else {
        Am_Value_List::End((Am_Value_List *)local_50);
        while (bVar1 = Am_Value_List::First((Am_Value_List *)local_50), ((bVar1 ^ 0xffU) & 1) != 0)
        {
          pAVar2 = Am_Value_List::Get((Am_Value_List *)local_50);
          Am_Object::operator=(&local_30,pAVar2);
          Am_Object::Am_Object(&group,&local_30);
          Am_To_Bottom(&group);
          Am_Object::~Am_Object(&group);
          Am_Value_List::Prev((Am_Value_List *)local_50);
        }
      }
    }
    else {
      Am_Object::Am_Object((Am_Object *)&places.item);
      Am_Value_List::Am_Value_List((Am_Value_List *)local_90);
      pAVar2 = Am_Object::Get(command_obj,0x171,0);
      Am_Object::operator=((Am_Object *)&places.item,pAVar2);
      pAVar2 = Am_Object::Get(command_obj,0x1e4,0);
      Am_Value_List::operator=((Am_Value_List *)local_90,pAVar2);
      Am_Object::Am_Object(&local_98,(Am_Object *)&places.item);
      Am_Value_List::Am_Value_List(&local_a8,(Am_Value_List *)local_50);
      Am_Value_List::Am_Value_List(&local_b8,(Am_Value_List *)local_90);
      Am_Put_Objects_Back_In_Place(&local_98,&local_a8,&local_b8,false);
      Am_Value_List::~Am_Value_List(&local_b8);
      Am_Value_List::~Am_Value_List(&local_a8);
      Am_Object::~Am_Object(&local_98);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_90);
      Am_Object::~Am_Object((Am_Object *)&places.item);
    }
    Am_Object::Set(command_obj,0x16f,(bool)(~local_61 & 1),0);
  }
  else {
    if (!reload_data) {
      in_value = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_50);
      Am_Value::operator=(new_sel,in_value);
    }
    Am_Object::Am_Object(&local_c0,command_obj);
    Am_Value::Am_Value(&local_d0,new_sel);
    do_to_top_or_bottom(&local_c0,to_top,&local_d0);
    Am_Value::~Am_Value(&local_d0);
    Am_Object::~Am_Object(&local_c0);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_50);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&obj);
  return;
}

Assistant:

void
to_top_or_bottom_general_undo_redo(Am_Object command_obj, bool undo,
                                   bool selective, bool reload_data,
                                   bool to_top, Am_Value new_sel = Am_No_Value)
{
  Am_Object selection_widget, obj;
  Am_Value_List objs;
  selection_widget = Am_Get_Selection_Widget_For_Command(command_obj);
  objs = command_obj.Get(Am_OBJECT_MODIFIED);

  if (undo) {
    if (selective)
      Am_Error("Selective Undo of to top not allowed");
    bool currently_undone = command_obj.Get(Am_HAS_BEEN_UNDONE);
    if (currently_undone) { // then redo = move objects to
                            // top or bottom again.  Assume places is still OK
      if (to_top) {
        for (objs.Start(); !objs.Last(); objs.Next()) {
          obj = objs.Get();
          Am_To_Top(obj);
        }
      } else {
        // have to go through the list in reverse order
        for (objs.End(); !objs.First(); objs.Prev()) {
          obj = objs.Get();
          Am_To_Bottom(obj);
        }
      }
    } else { // regular undo; restore the objects to where they were
      Am_Object group;
      Am_Value_List places;
      group = command_obj.Get(Am_SAVED_OLD_OBJECT_OWNER);
      places = command_obj.Get(Am_OBJECT_MODIFIED_PLACES);
      Am_Put_Objects_Back_In_Place(group, objs, places, false);
    }
    command_obj.Set(Am_HAS_BEEN_UNDONE, !currently_undone);
  } else { // repeat, to top or bottom again
    if (!reload_data)
      new_sel = objs;
    do_to_top_or_bottom(command_obj, to_top, new_sel);
  }
}